

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PipelineProgramCase::iterate(PipelineProgramCase *this)

{
  undefined4 stages;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  ProgramSources *pPVar8;
  TestError *this_00;
  undefined4 local_4bc;
  undefined1 local_498 [8];
  ProgramPipeline pipeline_1;
  string local_480;
  allocator<char> local_459;
  string local_458;
  ScopedLogSection local_438;
  ScopedLogSection section_2;
  ProgramPipeline pipeline;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  ScopedLogSection local_3d0;
  ScopedLogSection section_1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  ScopedLogSection local_350;
  ScopedLogSection section;
  ShaderProgram program;
  string local_270;
  ShaderSource local_250;
  ProgramSeparable local_222;
  allocator<char> local_221;
  string local_220;
  ShaderSource local_200;
  ProgramSeparable local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  ShaderSource local_1b0;
  ProgramSeparable local_181;
  undefined1 local_180 [8];
  ProgramSources sources;
  int stageBit;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  PipelineProgramCase *this_local;
  
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar7);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar7,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  if (this->m_targetStage == 0x8b31) {
    local_4bc._0_1_ = true;
    local_4bc._1_3_ = 0;
  }
  else {
    local_4bc._0_1_ = true;
    local_4bc._1_3_ = 0;
    if (this->m_targetStage == 0x8b30) {
      local_4bc._0_1_ = true;
      local_4bc._1_3_ = 0;
    }
  }
  sources.separable = local_4bc._0_1_;
  sources._201_3_ = local_4bc._1_3_;
  glu::ProgramSources::ProgramSources((ProgramSources *)local_180);
  if (this->m_targetStage == 0x8b31) {
    glu::ProgramSeparable::ProgramSeparable(&local_181,true);
    pPVar8 = glu::ProgramSources::operator<<((ProgramSources *)local_180,&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,
               "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
               ,&local_1d1);
    glu::VertexSource::VertexSource((VertexSource *)&local_1b0,&local_1d0);
    glu::ProgramSources::operator<<(pPVar8,&local_1b0);
    glu::VertexSource::~VertexSource((VertexSource *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  else if (this->m_targetStage == 0x8b30) {
    glu::ProgramSeparable::ProgramSeparable(&local_1d2,true);
    pPVar8 = glu::ProgramSources::operator<<((ProgramSources *)local_180,&local_1d2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "#version 310 es\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
               ,&local_221);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_200,&local_220);
    glu::ProgramSources::operator<<(pPVar8,&local_200);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
  }
  else if (this->m_targetStage == 0x91b9) {
    glu::ProgramSeparable::ProgramSeparable(&local_222,true);
    pPVar8 = glu::ProgramSources::operator<<((ProgramSources *)local_180,&local_222);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "#version 310 es\nlayout (local_size_x = 1, local_size_y = 1) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
               ,(allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_250,&local_270);
    glu::ProgramSources::operator<<(pPVar8,&local_250);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  }
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&section,pRVar6,(ProgramSources *)local_180);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"program",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"Program",&local_399);
  tcu::ScopedLogSection::ScopedLogSection(&local_350,pTVar7,&local_370,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,(ShaderProgram *)&section);
  tcu::ScopedLogSection::~ScopedLogSection(&local_350);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)&section);
  if (bVar1) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Initial",&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"Initial",(allocator<char> *)&pipeline.field_0xf);
    tcu::ScopedLogSection::ScopedLogSection(&local_3d0,pTVar7,&local_3f0,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&pipeline.field_0xf);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)&section_2,pRVar6);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&section_2);
    glu::CallLogWrapper::glBindProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3);
    GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar4,"setup pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,200);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&section_2);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               dVar3,this->m_targetStage,0,this->m_verifier);
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&section_2);
    tcu::ScopedLogSection::~ScopedLogSection(&local_3d0);
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"Set",&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"Set",(allocator<char> *)&pipeline_1.field_0xf);
    tcu::ScopedLogSection::ScopedLogSection(&local_438,pTVar7,&local_458,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator((allocator<char> *)&pipeline_1.field_0xf);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)local_498,pRVar6);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)local_498);
    glu::CallLogWrapper::glBindProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)local_498);
    stages = sources._200_4_;
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&section);
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3,stages,dVar5);
    GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar4,"setup pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0xd3);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)local_498);
    GVar4 = this->m_targetStage;
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&section);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               dVar3,GVar4,dVar5,this->m_verifier);
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)local_498);
    tcu::ScopedLogSection::~ScopedLogSection(&local_438);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&section);
    tcu::ResultCollector::setTestContextResult
              ((ResultCollector *)local_78,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_180);
    tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
    glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    return STOP;
  }
  section_1.m_log._6_1_ = 1;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"failed to build program",
             (allocator<char> *)((long)&section_1.m_log + 7));
  tcu::TestError::TestError(this_00,&local_3c0);
  section_1.m_log._6_1_ = 0;
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

PipelineProgramCase::IterateResult PipelineProgramCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const int				stageBit	= (m_targetStage == GL_VERTEX_SHADER)	? (GL_VERTEX_SHADER_BIT)
										: (m_targetStage == GL_FRAGMENT_SHADER)	? (GL_FRAGMENT_SHADER_BIT)
										: (GL_COMPUTE_SHADER_BIT);
	glu::ProgramSources	sources;

	if (m_targetStage == GL_VERTEX_SHADER)
		sources << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource);
	else if (m_targetStage == GL_FRAGMENT_SHADER)
		sources << glu::ProgramSeparable(true) << glu::FragmentSource(s_fragmentSource);
	else if (m_targetStage == GL_COMPUTE_SHADER)
		sources << glu::ProgramSeparable(true) << glu::ComputeSource(s_computeSource);
	else
		DE_ASSERT(false);

	gl.enableLogging(true);

	{
		glu::ShaderProgram program(m_context.getRenderContext(), sources);

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "program", "Program");
			m_testCtx.getLog() << program;
		}

		if (!program.isOk())
			throw tcu::TestError("failed to build program");

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Initial", "Initial");
			glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

			gl.glBindProgramPipeline(pipeline.getPipeline());
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup pipeline");

			verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), m_targetStage, 0, m_verifier);
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Set", "Set");
			glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

			gl.glBindProgramPipeline(pipeline.getPipeline());
			gl.glUseProgramStages(pipeline.getPipeline(), stageBit, program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup pipeline");

			verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), m_targetStage, program.getProgram(), m_verifier);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}